

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinLength
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  HeapEntity *pHVar1;
  size_type sVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  string *msg;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  LocationRange *in_RSI;
  Interpreter *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Value VVar11;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  fields;
  HeapEntity *e;
  string *in_stack_fffffffffffffea8;
  LocationRange *in_stack_fffffffffffffeb0;
  Interpreter *in_stack_fffffffffffffeb8;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_ffffffffffffff3c;
  HeapObject *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uStack_a4;
  undefined4 uStack_94;
  allocator<char> local_39 [33];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  LocationRange *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          ::size(in_RDX);
  if (sVar2 == 1) {
    pvVar4 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_18,0);
    pHVar1 = (pvVar4->v).h;
    pvVar4 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             ::operator[](local_18,0);
    switch(pvVar4->t) {
    case ARRAY:
      sVar2 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                      *)(pHVar1 + 1));
      auVar8._8_4_ = (int)(sVar2 >> 0x20);
      auVar8._0_8_ = sVar2;
      auVar8._12_4_ = 0x45300000;
      VVar11 = makeNumber(in_RDI,(auVar8._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
      *(ulong *)&in_RDI->scratch = CONCAT44(uStack_a4,VVar11.t);
      (in_RDI->scratch).v = VVar11.v;
      break;
    case FUNCTION:
      sVar2 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
              ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                      *)(pHVar1 + 5));
      auVar10._8_4_ = (int)(sVar2 >> 0x20);
      auVar10._0_8_ = sVar2;
      auVar10._12_4_ = 0x45300000;
      VVar11 = makeNumber(in_RDI,(auVar10._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
      *(ulong *)&in_RDI->scratch = CONCAT44(in_stack_ffffffffffffff3c,VVar11.t);
      (in_RDI->scratch).v = VVar11.v;
      break;
    case OBJECT:
      objectFields((Interpreter *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff40,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
      sVar5 = std::
              set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::size((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      *)0x22ed52);
      auVar7._8_4_ = (int)(sVar5 >> 0x20);
      auVar7._0_8_ = sVar5;
      auVar7._12_4_ = 0x45300000;
      VVar11 = makeNumber(in_RDI,(auVar7._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
      *(ulong *)&in_RDI->scratch = CONCAT44(uStack_94,VVar11.t);
      (in_RDI->scratch).v = VVar11.v;
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x22edbe);
      break;
    case STRING:
      sVar6 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::length
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(pHVar1 + 1));
      auVar9._8_4_ = (int)(sVar6 >> 0x20);
      auVar9._0_8_ = sVar6;
      auVar9._12_4_ = 0x45300000;
      VVar11 = makeNumber(in_RDI,(auVar9._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
      *(ulong *)&in_RDI->scratch = CONCAT44(in_stack_ffffffffffffff4c,VVar11.t);
      (in_RDI->scratch).v = VVar11.v;
      break;
    default:
      msg = (string *)__cxa_allocate_exception(0x38);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
      ::operator[](local_18,0);
      (anonymous_namespace)::type_str_abi_cxx11_((Value *)msg);
      std::operator+((char *)in_stack_fffffffffffffeb8,&local_10->file);
      makeError(in_stack_fffffffffffffeb8,local_10,msg);
      __cxa_throw(msg,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    return (AST *)0x0;
  }
  uVar3 = __cxa_allocate_exception(0x38);
  __a = local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),(char *)in_RDI,__a);
  makeError(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  __cxa_throw(uVar3,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinLength(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args.size() != 1) {
            throw makeError(loc, "length takes 1 parameter.");
        }
        HeapEntity *e = args[0].v.h;
        switch (args[0].t) {
            case Value::OBJECT: {
                auto fields = objectFields(static_cast<HeapObject *>(e), true);
                scratch = makeNumber(fields.size());
            } break;

            case Value::ARRAY:
                scratch = makeNumber(static_cast<HeapArray *>(e)->elements.size());
                break;

            case Value::STRING:
                scratch = makeNumber(static_cast<HeapString *>(e)->value.length());
                break;

            case Value::FUNCTION:
                scratch = makeNumber(static_cast<HeapClosure *>(e)->params.size());
                break;

            default:
                throw makeError(loc,
                                "length operates on strings, objects, "
                                "and arrays, got " +
                                    type_str(args[0]));
        }
        return nullptr;
    }